

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_epoll_wait(int epoll_fd,int maxevents,int timeout)

{
  int __fd;
  long lVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  long alStack_4a0 [3];
  epoll_event *local_488;
  ssize_t local_480;
  undefined1 local_478 [8];
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  uint64_t val;
  long lStack_250;
  int i;
  undefined1 local_248 [8];
  char buf [512];
  int err;
  int64_t result;
  int rc;
  unsigned_long __vla_expr0;
  int timeout_local;
  int maxevents_local;
  int epoll_fd_local;
  
  lVar1 = -((ulong)(uint)maxevents * 0xc + 0xf & 0xfffffffffffffff0);
  local_488 = (epoll_event *)((long)&local_488 + lVar1);
  *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x109709;
  iVar2 = epoll_wait(epoll_fd,(epoll_event *)((long)&local_488 + lVar1),maxevents,timeout);
  lStack_250 = (long)iVar2;
  if (lStack_250 == -1) {
    *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x10971b;
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x109734;
    __xpg_strerror_r(iVar2,local_248,0x200);
    *(undefined1 **)((long)alStack_4a0 + lVar1 + 8) = local_248;
    *(undefined8 *)((long)alStack_4a0 + lVar1) = 0x109775;
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xbb,"vfio_epoll_wait","to handle epoll wait");
    *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x109781;
    exit(iVar2);
  }
  if (0 < iVar2) {
    for (val._4_4_ = 0; val._4_4_ < iVar2; val._4_4_ = val._4_4_ + 1) {
      __fd = *(int *)(&local_488->field_0x4 + (long)val._4_4_ * 0xc);
      *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x1097e2;
      sVar4 = read(__fd,&result_1,8);
      if (sVar4 == -1) {
        *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x1097f8;
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x109817;
        __xpg_strerror_r(iVar2,local_478,0x200);
        *(undefined1 **)((long)alStack_4a0 + lVar1 + 8) = local_478;
        *(undefined8 *)((long)alStack_4a0 + lVar1) = 0x109858;
        fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0xc1,"vfio_epoll_wait","to read event");
        *(undefined8 *)((long)alStack_4a0 + lVar1 + 0x10) = 0x109867;
        exit(iVar2);
      }
      local_480 = sVar4;
    }
  }
  return iVar2;
}

Assistant:

int vfio_epoll_wait(int epoll_fd, int maxevents, int timeout) {
	struct epoll_event events[maxevents];
	int rc;

	while (1) {
		// Waiting for packets
		rc = (int) check_err(epoll_wait(epoll_fd, events, maxevents, timeout), "to handle epoll wait");
		if (rc > 0) {
			/* epoll_wait has at least one fd ready to read */
			for (int i = 0; i < rc; i++) {
				uint64_t val;
				// read event file descriptor to clear interrupt.
				check_err(read(events[i].data.fd, &val, sizeof(val)), "to read event");
			}
			break;
		} else {
			/* rc == 0, epoll_wait timed out */
			break;
		}
	}

	return rc;
}